

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O1

void __thiscall duckdb::NotNullConstraint::Serialize(NotNullConstraint *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"type");
  Serializer::WriteValue<duckdb::ConstraintType>(serializer,(this->super_Constraint).type);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"index");
  (*serializer->_vptr_Serializer[0x15])(serializer,(this->index).index);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void NotNullConstraint::Serialize(Serializer &serializer) const {
	Constraint::Serialize(serializer);
	serializer.WriteProperty<LogicalIndex>(200, "index", index);
}